

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

int __thiscall P_Quantifier::match(P_Quantifier *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  bool bVar7;
  bool bVar8;
  undefined1 local_80 [2];
  bool stop;
  bool again;
  uint count;
  StateP sp;
  vector<StateP,_std::allocator<StateP>_> *stk_local;
  P_Quantifier *this_local;
  
  sp._96_8_ = stk;
  pvVar4 = std::vector<StateP,_std::allocator<StateP>_>::back(stk);
  StateP::StateP((StateP *)local_80,pvVar4);
  std::vector<StateP,_std::allocator<StateP>_>::pop_back
            ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
  puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)&sp.st.flags);
  uVar1 = *puVar5;
  bVar7 = uVar1 < this->maximum;
  bVar8 = this->minimum <= uVar1;
  bVar3 = bVar8;
  if ((this->reluctant & 1U) != 0) {
    bVar3 = bVar7;
  }
  if (bVar3) {
    std::vector<StateP,_std::allocator<StateP>_>::push_back
              ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_,(value_type *)local_80);
    iVar2 = this->offset;
    pvVar4 = std::vector<StateP,_std::allocator<StateP>_>::back
                       ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
    pvVar4->iseq = iVar2 + pvVar4->iseq;
    pvVar4 = std::vector<StateP,_std::allocator<StateP>_>::back
                       ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
    std::vector<int,_std::allocator<int>_>::pop_back(&(pvVar4->st).qcount);
  }
  if ((this->reluctant & 1U) != 0) {
    bVar7 = bVar8;
  }
  if (bVar7) {
    std::vector<StateP,_std::allocator<StateP>_>::push_back
              ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_,(value_type *)local_80);
    pvVar4 = std::vector<StateP,_std::allocator<StateP>_>::back
                       ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
    pvVar4->iseq = pvVar4->iseq + 1;
    pvVar4 = std::vector<StateP,_std::allocator<StateP>_>::back
                       ((vector<StateP,_std::allocator<StateP>_> *)sp._96_8_);
    pvVar6 = std::vector<int,_std::allocator<int>_>::back(&(pvVar4->st).qcount);
    *pvVar6 = *pvVar6 + 1;
  }
  StateP::~StateP((StateP *)local_80);
  return 0;
}

Assistant:

int P_Quantifier::match(vector<StateP> &stk) {
    StateP sp = stk.back(); stk.pop_back();
    unsigned count = sp.st.qcount.back();
    bool again = count < maximum, stop = count >= minimum;
    if (reluctant ? again : stop) {
        stk.push_back(sp);
        stk.back().iseq += offset;
        stk.back().st.qcount.pop_back();
    } 
    if (reluctant ? stop : again) {
        stk.push_back(sp);
        stk.back().iseq++;
        stk.back().st.qcount.back()++;
    }
    return 0;
}